

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool container_nonzero_cardinality(container_t *c,uint8_t typecode)

{
  _Bool _Var1;
  bool bVar2;
  bitset_container_t *bitset;
  uint8_t local_9;
  
  local_9 = typecode;
  bitset = (bitset_container_t *)container_unwrap_shared(c,&local_9);
  if ((local_9 == '\x03') || (local_9 == '\x02')) {
    bVar2 = 0 < bitset->cardinality;
  }
  else {
    if (local_9 != '\x01') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x11c6,"_Bool container_nonzero_cardinality(const container_t *, uint8_t)");
    }
    _Var1 = bitset_container_empty(bitset);
    bVar2 = !_Var1;
  }
  return bVar2;
}

Assistant:

static inline bool container_nonzero_cardinality(
    const container_t *c, uint8_t typecode
){
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_const_nonzero_cardinality(
                            const_CAST_bitset(c));
        case ARRAY_CONTAINER_TYPE:
            return array_container_nonzero_cardinality(const_CAST_array(c));
        case RUN_CONTAINER_TYPE:
            return run_container_nonzero_cardinality(const_CAST_run(c));
    }
    assert(false);
    __builtin_unreachable();
    return 0;  // unreached
}